

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u64 sqlite3LogEstToInt(LogEst x)

{
  long lVar1;
  char cVar2;
  int iVar3;
  ushort uVar4;
  undefined2 in_register_0000003a;
  
  if (0x261 < CONCAT22(in_register_0000003a,x)) {
    return 0x7fffffffffffffff;
  }
  iVar3 = CONCAT22(in_register_0000003a,x) * 0x6667;
  iVar3 = (iVar3 >> 0x12) - (iVar3 >> 0x1f);
  uVar4 = x + (short)iVar3 * -10;
  lVar1 = 0;
  if (uVar4 != 0) {
    lVar1 = (long)(short)uVar4 + -1;
  }
  if (4 < uVar4) {
    lVar1 = (long)(short)uVar4 + -2;
  }
  cVar2 = (char)iVar3;
  if (0x1d < x) {
    return lVar1 + 8U << (cVar2 - 3U & 0x3f);
  }
  return lVar1 + 8U >> (3U - cVar2 & 0x3f);
}

Assistant:

SQLITE_PRIVATE u64 sqlite3LogEstToInt(LogEst x){
  u64 n;
  n = x%10;
  x /= 10;
  if( n>=5 ) n -= 2;
  else if( n>=1 ) n -= 1;
  if( x>60 ) return (u64)LARGEST_INT64;
  return x>=3 ? (n+8)<<(x-3) : (n+8)>>(3-x);
}